

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AI.cpp
# Opt level: O0

void AI::recommendHitForPlayer(Player *player,int *recommendedHit)

{
  bool bVar1;
  bool bVar2;
  short sVar3;
  int iVar4;
  time_t tVar5;
  ostream *poVar6;
  int local_24;
  int local_20;
  int j;
  int i;
  bool found;
  int *recommendedHit_local;
  Player *player_local;
  
  tVar5 = time((time_t *)0x0);
  srand((uint)tVar5);
  *recommendedHit = -1;
  recommendedHit[1] = -1;
  bVar1 = false;
  for (local_20 = 1; local_20 < 0xb; local_20 = local_20 + 1) {
    for (local_24 = 1; local_24 < 0xb; local_24 = local_24 + 1) {
      sVar3 = Player::getEnemyCellInfo(player,local_20,local_24);
      if ((sVar3 == 300) && (bVar2 = unknownCellsNearby(player,local_20,local_24), bVar2)) {
        findUnknownCellNearby(player,local_20,local_24,recommendedHit);
        bVar1 = true;
        poVar6 = (ostream *)
                 std::ostream::operator<<
                           ((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
        poVar6 = std::operator<<(poVar6,"found?: ");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,true);
        std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
        Keyboard::getch();
        break;
      }
    }
    if (bVar1) break;
  }
  if (!bVar1) {
    iVar4 = rand();
    *recommendedHit = iVar4 % 10 + 1;
    iVar4 = rand();
    recommendedHit[1] = iVar4 % 10 + 1;
    while (sVar3 = Player::getEnemyCellInfo(player,*recommendedHit,recommendedHit[1]), sVar3 != 0) {
      iVar4 = rand();
      *recommendedHit = iVar4 % 10 + 1;
      iVar4 = rand();
      recommendedHit[1] = iVar4 % 10 + 1;
    }
  }
  return;
}

Assistant:

void AI::recommendHitForPlayer(Player & player, int * recommendedHit) {
    srand(time(NULL));
    recommendedHit[0] = -1;
    recommendedHit[1] = -1;
    bool found = false;
    for(int i = 1; i <= 10; i++)
    {
        for(int j = 1; j <= 10; j++)
        {
            if (player.getEnemyCellInfo(i,j) == Player::SHOOT_CODE && unknownCellsNearby(player, i, j))
            {
                findUnknownCellNearby(player, i, j, recommendedHit);

                found = true;
                std::cout << std::endl << "found?: " <<found << std::endl;
                Keyboard::getch();
                break;
            }
        }
        if(found) break;
    }
    //std::cout << std::endl << "found?: " << (char*) found << std::endl;
    if (!found)
    {

        recommendedHit[0] = rand() % 10 + 1;
        recommendedHit[1] = rand() % 10 + 1;
        while(player.getEnemyCellInfo(recommendedHit[0],recommendedHit[1]) != Player::UNKNOWN_CODE)
        {
            recommendedHit[0] = rand() % 10 + 1;
            recommendedHit[1] = rand() % 10 + 1;
        }
    }
}